

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__effect
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ParserTemplateBase *this_00;
  long *in_RSI;
  void **in_RDI;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  effect__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  StringHash in_stack_ffffffffffffffb8;
  StringHash in_stack_ffffffffffffffc0;
  undefined8 *puVar2;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::effect__AttributeData>
                      (in_stack_ffffffffffffffb0,in_RDI);
  puVar2 = (undefined8 *)*in_RSI;
  if (puVar2 == (undefined8 *)0x0) {
LAB_009c7d38:
    if (((this_00->super_Parser)._vptr_Parser == (_func_int **)0x0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (this_00,(Severity)((ulong)puVar2 >> 0x20),(ErrorType)puVar2,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        while( true ) {
          if ((ParserChar *)*puVar2 == (ParserChar *)0x0) {
            in_stack_ffffffffffffffc0 = 0;
            goto LAB_009c7d38;
          }
          in_stack_ffffffffffffffb8 =
               GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)*puVar2);
          if (puVar2 + 1 == (undefined8 *)0x0) {
            return false;
          }
          in_stack_ffffffffffffffb0 = (ParserTemplateBase *)puVar2[1];
          puVar2 = puVar2 + 2;
          if (in_stack_ffffffffffffffb8 != 0x6f4) break;
          (this_00->super_Parser)._vptr_Parser = (_func_int **)in_stack_ffffffffffffffb0;
        }
        if (in_stack_ffffffffffffffb8 != 0x74835) break;
        (this_00->super_Parser).mSaxParser = (SaxParser *)in_stack_ffffffffffffffb0;
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__effect( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__effect( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

effect__AttributeData* attributeData = newData<effect__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_EFFECT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( !attributeData->id )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_EFFECT, HASH_ATTRIBUTE_ID, 0 ) )
        return false;
}


    return true;
}